

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O1

XmlAttributePtr __thiscall libcellml::XmlAttribute::next(XmlAttribute *this)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  XmlAttribute XVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined8 *in_RSI;
  XmlAttribute *__tmp;
  XmlAttributePtr XVar4;
  undefined1 local_29;
  XmlAttribute local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  pvVar1 = *(void **)(*(long *)*in_RSI + 0x30);
  this->mPimpl = (XmlAttributeImpl *)0x0;
  this[1].mPimpl = (XmlAttributeImpl *)0x0;
  if (pvVar1 != (void *)0x0) {
    local_28.mPimpl = (XmlAttributeImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlAttribute,std::allocator<libcellml::XmlAttribute>>
              (&_Stack_20,(XmlAttribute **)&local_28,(allocator<libcellml::XmlAttribute> *)&local_29
              );
    _Var3._M_pi = _Stack_20._M_pi;
    XVar2.mPimpl = local_28.mPimpl;
    local_28.mPimpl = (XmlAttributeImpl *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->mPimpl = (XmlAttributeImpl *)XVar2;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this[1].mPimpl;
    this[1].mPimpl = (XmlAttributeImpl *)_Var3._M_pi;
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX_00;
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      in_RDX._M_pi = extraout_RDX_01;
    }
    (XVar2.mPimpl)->mXmlAttributePtr->_private = pvVar1;
  }
  XVar4.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar4.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlAttributePtr)
         XVar4.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlAttributePtr XmlAttribute::next() const
{
    xmlAttrPtr next = mPimpl->mXmlAttributePtr->next;
    XmlAttributePtr nextHandle = nullptr;
    if (next != nullptr) {
        nextHandle = std::make_shared<XmlAttribute>();
        nextHandle->setXmlAttribute(next);
    }
    return nextHandle;
}